

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj4fio.h
# Opt level: O1

ssize_t fiobj_send_free(intptr_t uuid,FIOBJ o)

{
  fio_write_args_s options;
  char cVar1;
  fiobj_object_vtable_s *pfVar2;
  ssize_t sVar3;
  uint uVar4;
  uint uVar5;
  fio_str_info_s s;
  fio_str_info_s local_58;
  FIOBJ local_38;
  code *pcStack_30;
  undefined8 local_28;
  long lStack_20;
  byte local_18;
  undefined7 uStack_17;
  
  if (o == 0) {
LAB_00150dc8:
    local_58.data = anon_var_dwarf_20f;
    local_58.len._0_4_ = 4;
    goto LAB_00150ddb;
  }
  if ((o & 1) != 0) {
    fio_ltocstr(&local_58,(long)o >> 1);
    goto LAB_00150e7b;
  }
  uVar4 = (uint)o & 6;
  cVar1 = '(';
  switch(uVar4) {
  case 0:
switchD_00150d8f_caseD_0:
    cVar1 = *(char *)(o & 0xfffffffffffffff8);
    break;
  case 4:
switchD_00150d8f_caseD_4:
    cVar1 = '*';
    break;
  case 6:
    if ((char)o == '&') {
      local_58.data = anon_var_dwarf_21a;
      local_58.len._0_4_ = 5;
    }
    else {
      uVar5 = (uint)o & 0xff;
      if (uVar5 != 0x16) {
        if (uVar5 == 6) goto LAB_00150dc8;
        switch(uVar4) {
        case 0:
          goto switchD_00150d8f_caseD_0;
        case 4:
          goto switchD_00150d8f_caseD_4;
        case 6:
          cVar1 = (char)o;
        }
        break;
      }
      local_58.data = anon_var_dwarf_225;
      local_58.len._0_4_ = 4;
    }
LAB_00150ddb:
    local_58.capa._0_4_ = 0;
    local_58.capa._4_4_ = 0;
    local_58.len._4_4_ = 0;
    goto LAB_00150e7b;
  }
  switch(cVar1) {
  case '\'':
    pfVar2 = &FIOBJECT_VTABLE_FLOAT;
    break;
  case '(':
    pfVar2 = &FIOBJECT_VTABLE_STRING;
    break;
  case ')':
    pfVar2 = &FIOBJECT_VTABLE_ARRAY;
    break;
  case '*':
    pfVar2 = &FIOBJECT_VTABLE_HASH;
    break;
  case '+':
    pfVar2 = &FIOBJECT_VTABLE_DATA;
    break;
  default:
    pfVar2 = &FIOBJECT_VTABLE_NUMBER;
  }
  (*pfVar2->to_str)(&local_58,o);
LAB_00150e7b:
  pcStack_30 = fiobj4sock_dealloc;
  local_28 = CONCAT44(local_58.len._4_4_,(undefined4)local_58.len);
  lStack_20 = (long)local_58.data - o;
  options.after.dealloc = fiobj4sock_dealloc;
  options.data.fd = o;
  options.length = local_28;
  options.offset = lStack_20;
  options._32_8_ = CONCAT71(uStack_17,local_18) & 0xfffffffffffffff0;
  local_38 = o;
  local_18 = local_18 & 0xf0;
  sVar3 = fio_write2_fn(uuid,options);
  return sVar3;
}

Assistant:

static inline __attribute__((unused)) ssize_t fiobj_send_free(intptr_t uuid,
                                                              FIOBJ o) {
  fio_str_info_s s = fiobj_obj2cstr(o);
  return fio_write2(uuid, .data.buffer = (void *)(o),
                    .offset = (uintptr_t)(((intptr_t)s.data) - ((intptr_t)(o))),
                    .length = s.len, .after.dealloc = fiobj4sock_dealloc);
}